

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata_cache.c
# Opt level: O1

void duckdb_je_edata_cache_put(tsdn_t *tsdn,edata_cache_t *edata_cache,edata_t *edata)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  
  __mutex = (pthread_mutex_t *)((long)&(edata_cache->mtx).field_0 + 0x48);
  iVar3 = pthread_mutex_trylock(__mutex);
  if (iVar3 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&edata_cache->mtx);
    (edata_cache->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(edata_cache->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((edata_cache->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (edata_cache->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(edata_cache->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  duckdb_je_edata_avail_insert(&edata_cache->avail,edata);
  (edata_cache->count).repr = (edata_cache->count).repr + 1;
  (edata_cache->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
edata_cache_put(tsdn_t *tsdn, edata_cache_t *edata_cache, edata_t *edata) {
	malloc_mutex_lock(tsdn, &edata_cache->mtx);
	edata_avail_insert(&edata_cache->avail, edata);
	atomic_load_add_store_zu(&edata_cache->count, 1);
	malloc_mutex_unlock(tsdn, &edata_cache->mtx);
}